

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_server.c
# Opt level: O1

apx_error_t json_server_init(apx_connection_tag *apx_connection,uint8_t addressFamily)

{
  msocket_handler_t handler;
  code *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (apx_connection != (apx_connection_tag *)0x0) {
    m_apx_connection = apx_connection;
    m_server = (msocket_server_t *)msocket_server_new(addressFamily,json_server_connection_vdelete);
    if (m_server != (msocket_server_t *)0x0) {
      uStack_30 = 0;
      local_18 = 0;
      uStack_10 = 0;
      local_28 = 0;
      uStack_20 = 0;
      local_38 = json_server_accept;
      msocket_server_set_handler(m_server,&local_38,0);
    }
    return 0;
  }
  __assert_fail("apx_connection != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_node/src/json_server.c"
                ,0x3a,"apx_error_t json_server_init(struct apx_connection_tag *, uint8_t)");
}

Assistant:

apx_error_t json_server_init(struct apx_connection_tag *apx_connection, uint8_t addressFamily)
{
   assert(apx_connection != 0);
   m_apx_connection = apx_connection;
   m_server = msocket_server_new(addressFamily, json_server_connection_vdelete);
   if (m_server != 0)
   {
      msocket_handler_t handler;
      memset(&handler, 0, sizeof(msocket_handler_t));
      handler.tcp_accept = json_server_accept;
      msocket_server_sethandler(m_server, &handler, (void*) 0);
   }
   return APX_NO_ERROR;
}